

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlGetBooleanProp(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,char *name,int def)

{
  int iVar1;
  xmlChar *str1;
  xmlNodePtr node_00;
  xmlSchemaTypePtr type;
  xmlChar *val;
  int def_local;
  char *name_local;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  str1 = xmlSchemaGetProp(ctxt,node,name);
  ctxt_local._4_4_ = def;
  if (str1 != (xmlChar *)0x0) {
    iVar1 = xmlStrEqual(str1,(xmlChar *)"true");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(str1,(xmlChar *)"false");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(str1,"1");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(str1,"0");
          if (iVar1 == 0) {
            node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,name);
            type = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
            xmlSchemaPSimpleTypeErr
                      (ctxt,XML_SCHEMAP_INVALID_BOOLEAN,(xmlSchemaBasicItemPtr)0x0,node_00,type,
                       (char *)0x0,str1,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            val._4_4_ = def;
          }
          else {
            val._4_4_ = 0;
          }
        }
        else {
          val._4_4_ = 1;
        }
      }
      else {
        val._4_4_ = 0;
      }
    }
    else {
      val._4_4_ = 1;
    }
    ctxt_local._4_4_ = val._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlGetBooleanProp(xmlSchemaParserCtxtPtr ctxt,
		  xmlNodePtr node,
                  const char *name, int def)
{
    const xmlChar *val;

    val = xmlSchemaGetProp(ctxt, node, name);
    if (val == NULL)
        return (def);
    /*
    * 3.2.2.1 Lexical representation
    * An instance of a datatype that is defined as `boolean`
    * can have the following legal literals {true, false, 1, 0}.
    */
    if (xmlStrEqual(val, BAD_CAST "true"))
        def = 1;
    else if (xmlStrEqual(val, BAD_CAST "false"))
        def = 0;
    else if (xmlStrEqual(val, BAD_CAST "1"))
	def = 1;
    else if (xmlStrEqual(val, BAD_CAST "0"))
        def = 0;
    else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_INVALID_BOOLEAN,
	    NULL,
	    (xmlNodePtr) xmlSchemaGetPropNode(node, name),
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN),
	    NULL, val, NULL, NULL, NULL);
    }
    return (def);
}